

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O0

vaddr arm_adjust_watchpoint_address_arm(CPUState *cs,vaddr addr,int len)

{
  _Bool _Var1;
  CPUARMState *env;
  ARMCPU *cpu;
  vaddr vStack_18;
  int len_local;
  vaddr addr_local;
  CPUState *cs_local;
  
  _Var1 = arm_sctlr_b((CPUARMState *)(cs[1].tb_jmp_cache + 0x3ff));
  vStack_18 = addr;
  if (_Var1) {
    if (len == 1) {
      vStack_18 = addr ^ 3;
    }
    else if (len == 2) {
      vStack_18 = addr ^ 2;
    }
  }
  return vStack_18;
}

Assistant:

vaddr arm_adjust_watchpoint_address(CPUState *cs, vaddr addr, int len)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;

    /*
     * In BE32 system mode, target memory is stored byteswapped (on a
     * little-endian host system), and by the time we reach here (via an
     * opcode helper) the addresses of subword accesses have been adjusted
     * to account for that, which means that watchpoints will not match.
     * Undo the adjustment here.
     */
    if (arm_sctlr_b(env)) {
        if (len == 1) {
            addr ^= 3;
        } else if (len == 2) {
            addr ^= 2;
        }
    }

    return addr;
}